

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::ScanLineInputFile::rawPixelDataToBuffer
          (ScanLineInputFile *this,int scanLine,char *pixelData,int *pixelDataSize)

{
  int iVar1;
  exr_storage_t eVar2;
  exr_context_t p_Var3;
  element_type *peVar4;
  ostream *poVar5;
  char *pcVar6;
  ArgExc *pAVar7;
  int *in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  stringstream _iex_throw_s_3;
  stringstream _iex_throw_s_2;
  stringstream _iex_throw_s_1;
  stringstream _iex_throw_s;
  exr_chunk_info_t cinfo;
  stringstream local_690 [16];
  ostream local_680 [268];
  int in_stack_fffffffffffffa8c;
  Context *in_stack_fffffffffffffa90;
  stringstream local_508 [16];
  ostream local_4f8 [376];
  stringstream local_380 [16];
  ostream local_370 [392];
  stringstream local_1e8 [16];
  ostream local_1d8 [376];
  undefined1 local_60 [32];
  ulong local_40;
  int *local_20;
  undefined8 local_18;
  undefined4 local_c;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  p_Var3 = Context::operator_cast_to__priv_exr_context_t_((Context *)0x22796b);
  peVar4 = std::
           __shared_ptr_access<Imf_3_4::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Imf_3_4::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x227984);
  iVar1 = exr_read_scanline_chunk_info(p_Var3,peVar4->partNumber,local_c,local_60);
  if (iVar1 != 0) {
    std::
    __shared_ptr_access<Imf_3_4::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<Imf_3_4::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x227cab);
    eVar2 = Context::storage(in_stack_fffffffffffffa90,in_stack_fffffffffffffa8c);
    if (eVar2 == EXR_STORAGE_TILED) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream(local_508);
      poVar5 = std::operator<<(local_4f8,"Error reading pixel data from image file \"");
      pcVar6 = fileName((ScanLineInputFile *)0x227d00);
      poVar5 = std::operator<<(poVar5,pcVar6);
      std::operator<<(poVar5,"\". Tried to read a raw scanline from a tiled image.");
      pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(pAVar7,local_508);
      __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_690);
    poVar5 = std::operator<<(local_680,"Error reading pixel data from image file \"");
    pcVar6 = fileName((ScanLineInputFile *)0x227df3);
    poVar5 = std::operator<<(poVar5,pcVar6);
    std::operator<<(poVar5,"\". Unable to query data block information.");
    pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar7,local_690);
    __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  if ((ulong)(long)*local_20 < local_40) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1e8);
    poVar5 = std::operator<<(local_1d8,"Error reading pixel data from image file \"");
    pcVar6 = fileName((ScanLineInputFile *)0x227a0a);
    poVar5 = std::operator<<(poVar5,pcVar6);
    poVar5 = std::operator<<(poVar5,"\". Provided buffer is too small to read raw pixel data:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,*local_20);
    std::operator<<(poVar5," bytes.");
    pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar7,local_1e8);
    __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  *local_20 = (int)local_40;
  p_Var3 = Context::operator_cast_to__priv_exr_context_t_((Context *)0x227b30);
  peVar4 = std::
           __shared_ptr_access<Imf_3_4::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Imf_3_4::ScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x227b46);
  iVar1 = exr_read_chunk(p_Var3,peVar4->partNumber,local_60,local_18);
  if (iVar1 != 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_380);
    poVar5 = std::operator<<(local_370,"Error reading pixel data from image file \"");
    pcVar6 = fileName((ScanLineInputFile *)0x227bab);
    poVar5 = std::operator<<(poVar5,pcVar6);
    poVar5 = std::operator<<(poVar5,"\". Unable to read raw pixel data of ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,*local_20);
    std::operator<<(poVar5," bytes.");
    pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar7,local_380);
    __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  return;
}

Assistant:

void
ScanLineInputFile::rawPixelDataToBuffer (
    int scanLine, char* pixelData, int& pixelDataSize) const
{
    exr_chunk_info_t cinfo;
    if (EXR_ERR_SUCCESS == exr_read_scanline_chunk_info (
                               _ctxt, _data->partNumber, scanLine, &cinfo))
    {
        if (cinfo.packed_size > static_cast<uint64_t> (pixelDataSize))
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Error reading pixel data from image "
                "file \""
                    << fileName ()
                    << "\". Provided buffer is too small to read raw pixel data:"
                    << pixelDataSize << " bytes.");
        }

        pixelDataSize = static_cast<int> (cinfo.packed_size);

        if (EXR_ERR_SUCCESS !=
            exr_read_chunk (_ctxt, _data->partNumber, &cinfo, pixelData))
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Error reading pixel data from image "
                "file \""
                    << fileName () << "\". Unable to read raw pixel data of "
                    << pixelDataSize << " bytes.");
        }
    }
    else
    {
        if (_ctxt.storage (_data->partNumber) == EXR_STORAGE_TILED)
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Error reading pixel data from image "
                "file \""
                    << fileName ()
                    << "\". Tried to read a raw scanline from a tiled image.");
        }
        else
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Error reading pixel data from image "
                "file \""
                    << fileName ()
                    << "\". Unable to query data block information.");
        }
    }
}